

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disco_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  function<void_()> *this;
  ostream *poVar2;
  char **in_RSI;
  int in_EDI;
  exception *e;
  service srv;
  allocator *__f;
  submitter local_170 [5];
  allocator local_141;
  string local_140 [32];
  mount_point local_120 [40];
  undefined1 local_f8 [23];
  allocator local_e1;
  string local_e0 [32];
  mount_point local_c0 [40];
  undefined1 local_98 [23];
  allocator local_81;
  string local_80 [32];
  mount_point local_60 [40];
  undefined1 local_38 [32];
  service local_18 [20];
  int local_4;
  
  local_4 = 0;
  cppcms::service::service(local_18,in_EDI,in_RSI);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<async_unit_test>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"/async",&local_81);
  cppcms::mount_point::mount_point(local_60,local_80);
  cppcms::applications_pool::mount(uVar1,local_38,local_60,1);
  cppcms::mount_point::~mount_point(local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10d62b);
  uVar1 = cppcms::service::applications_pool();
  cppcms::create_pool<nonblocking_unit_test>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"/nonblocking",&local_e1);
  cppcms::mount_point::mount_point(local_c0,local_e0);
  cppcms::applications_pool::mount(uVar1,local_98,local_c0,1);
  cppcms::mount_point::~mount_point(local_c0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10d6e7);
  this = (function<void_()> *)cppcms::service::applications_pool();
  cppcms::create_pool<unit_test>();
  __f = &local_141;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"/sync",__f);
  cppcms::mount_point::mount_point(local_120,local_140);
  cppcms::applications_pool::mount(this,local_f8,local_120,0);
  cppcms::mount_point::~mount_point(local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::shared_ptr<cppcms::application_specific_pool>::~shared_ptr
            ((shared_ptr<cppcms::application_specific_pool> *)0x10d791);
  submitter::submitter(local_170,local_18);
  std::function<void()>::function<submitter,void>(this,(submitter *)__f);
  cppcms::service::after_fork((function *)local_18);
  std::function<void_()>::~function((function<void_()> *)0x10d7d7);
  cppcms::service::run();
  cppcms::service::~service(local_18);
  if ((bad_count == 4) && (calls == 5)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Ok");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Failed bad_count = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bad_count);
    poVar2 = std::operator<<(poVar2," (exp 4) calls = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,calls);
    poVar2 = std::operator<<(poVar2," (exp 5)");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(int argc,char **argv)
{
	try {
		cppcms::service srv(argc,argv);
		srv.applications_pool().mount( 
			cppcms::create_pool<async_unit_test>(),
			cppcms::mount_point("/async"),
			cppcms::app::asynchronous);

		srv.applications_pool().mount(
			cppcms::create_pool<nonblocking_unit_test>(),
			cppcms::mount_point("/nonblocking"),
			cppcms::app::asynchronous);

		srv.applications_pool().mount( cppcms::create_pool<unit_test>(), cppcms::mount_point("/sync"));
		srv.after_fork(submitter(srv));
		srv.run();
	}
	catch(std::exception const &e) {
		std::cerr << e.what() << std::endl;
		return EXIT_FAILURE;
	}
	if(bad_count != 4 || calls != 5) {
		std::cerr << "Failed bad_count = " << bad_count << " (exp 4) calls = " << calls << " (exp 5)"<< std::endl;
		return EXIT_FAILURE;
	}
	std::cout << "Ok" << std::endl;
	return EXIT_SUCCESS;
}